

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_adds_a_d_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ulong uVar1;
  long lVar2;
  float64 fVar3;
  ulong uVar4;
  ulong uVar5;
  
  fVar3 = (env->active_fpu).fpr[ws].fd;
  uVar1 = (env->active_fpu).fpr[wt].fd;
  uVar5 = -fVar3;
  if (0 < (long)fVar3) {
    uVar5 = fVar3;
  }
  uVar4 = -uVar1;
  if (0 < (long)uVar1) {
    uVar4 = uVar1;
  }
  fVar3 = uVar4 + uVar5;
  if ((uVar4 ^ 0x7fffffffffffffff) <= uVar5) {
    fVar3 = 0x7fffffffffffffff;
  }
  (env->active_fpu).fpr[wd].fd = fVar3;
  uVar1 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  uVar5 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  uVar4 = -uVar1;
  if (0 < (long)uVar1) {
    uVar4 = uVar1;
  }
  uVar1 = -uVar5;
  if (0 < (long)uVar5) {
    uVar1 = uVar5;
  }
  lVar2 = uVar1 + uVar4;
  if ((uVar1 ^ 0x7fffffffffffffff) <= uVar4) {
    lVar2 = 0x7fffffffffffffff;
  }
  *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = lVar2;
  return;
}

Assistant:

void helper_msa_adds_a_d(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0]  = msa_adds_a_df(DF_DOUBLE, pws->d[0],  pwt->d[0]);
    pwd->d[1]  = msa_adds_a_df(DF_DOUBLE, pws->d[1],  pwt->d[1]);
}